

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall CLI::Option::run_callback(Option *this)

{
  results_t *this_00;
  MultiOptionPolicy MVar1;
  _Any_data *p_Var2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  int iVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ArgumentMismatch *pAVar9;
  ValidationError *this_01;
  ConversionError *this_02;
  uint uVar10;
  uint uVar11;
  string *delim;
  int iVar12;
  string *psVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_04;
  int iVar14;
  _Any_data *p_Var15;
  pointer pbVar16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string err_msg;
  results_t partial_result_2;
  allocator_type local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  pointer local_188;
  undefined1 local_180 [24];
  undefined1 local_168 [32];
  undefined1 local_148 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  string local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->validators_).
      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->validators_).
      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar16 = (this->results_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_188 = (this->results_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar16 != local_188) {
      do {
        p_Var2 = (_Any_data *)
                 (this->validators_).
                 super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (p_Var15 = (_Any_data *)
                       (this->validators_).
                       super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; p_Var15 != p_Var2;
            p_Var15 = p_Var15 + 2) {
          if (*(long *)(p_Var15 + 1) == 0) {
            ::std::__throw_bad_function_call();
          }
          (**(code **)(p_Var15->_M_pod_data + 0x18))(&local_1a8,p_Var15,pbVar16);
          if (local_1a8._M_string_length != 0) {
            this_01 = (ValidationError *)__cxa_allocate_exception(0x38);
            get_name_abi_cxx11_(&local_50,this,false,false);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,local_1a8._M_dataplus._M_p,
                       local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
            ValidationError::ValidationError(this_01,&local_50,&local_e8);
            __cxa_throw(this_01,&ValidationError::typeinfo,Error::~Error);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
        }
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 != local_188);
    }
  }
  MVar1 = (this->super_OptionBase<CLI::Option>).multi_option_policy_;
  uVar11 = this->type_size_;
  delim = (string *)(ulong)uVar11;
  iVar12 = this->expected_;
  uVar5 = 0xffffffff;
  uVar10 = (int)uVar11 >> 0x1f;
  if ((MVar1 == Throw) && (uVar5 = 1, iVar12 < 0)) {
    uVar5 = uVar10 | 1;
  }
  iVar14 = iVar12 * uVar11;
  iVar7 = -iVar14;
  if (0 < iVar14) {
    iVar7 = iVar14;
  }
  iVar6 = uVar5 * iVar14;
  iVar3 = -iVar6;
  if (0 < iVar6) {
    iVar3 = iVar6;
  }
  this_00 = &this->results_;
  __first._M_current =
       (this->results_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->results_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)__last._M_current - (long)__first._M_current >> 5;
  iVar6 = 1;
  if (iVar14 != 0) {
    iVar6 = iVar3;
  }
  if ((int)uVar8 <= iVar6) {
    iVar6 = (int)uVar8;
  }
  if (MVar1 == Join) {
    local_168._0_8_ = (pointer)(local_168 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"\n","");
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_1a8,(detail *)this_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168,delim);
    __l._M_len = 1;
    __l._M_array = &local_1a8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_180,__l,&local_1a9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_168._16_8_)->_M_p + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_148 + 0x18),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_180);
    if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    bVar4 = (*(this->callback_)._M_invoker)
                      ((_Any_data *)&this->callback_,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_148 + 0x18));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_148 + 0x18));
    this_04 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
  }
  else {
    if (MVar1 == TakeFirst) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a8,
                 __first,__first._M_current + iVar6,(allocator_type *)local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_118,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1a8);
      if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
      bVar4 = (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&local_118);
      this_03 = &local_118;
    }
    else {
      if (MVar1 != TakeLast) {
        uVar5 = 0xffffffff;
        if ((MVar1 == Throw) && (uVar5 = 1, iVar12 < 0)) {
          uVar5 = uVar10 | 1;
        }
        if ((int)(uVar5 * iVar7) < 1) {
          uVar5 = 0xffffffff;
          if ((MVar1 == Throw) && (uVar5 = 1, iVar12 < 0)) {
            uVar5 = uVar10 | 1;
          }
          if ((int)(uVar5 * iVar7) < 0) {
            uVar5 = 1;
            if ((MVar1 == Throw) && (uVar5 = 0xffffffff, iVar12 < 0)) {
              uVar5 = (int)~uVar11 >> 0x1f | 1;
            }
            if (uVar8 < (ulong)(long)(int)(uVar5 * iVar7)) {
LAB_001173b7:
              pAVar9 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
              get_name_abi_cxx11_(&local_90,this,false,false);
              uVar11 = 0xffffffff;
              if (((this->super_OptionBase<CLI::Option>).multi_option_policy_ == Throw) &&
                 (uVar11 = 1, this->expected_ < 0)) {
                uVar11 = this->type_size_ >> 0x1f | 1;
              }
              iVar7 = this->expected_ * this->type_size_;
              iVar12 = -iVar7;
              if (0 < iVar7) {
                iVar12 = iVar7;
              }
              ArgumentMismatch::ArgumentMismatch
                        (pAVar9,&local_90,iVar12 * uVar11,
                         (long)(this->results_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->results_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
              __cxa_throw(pAVar9,&ArgumentMismatch::typeinfo,Error::~Error);
            }
            psVar13 = (string *)(ulong)-uVar11;
            if (0 < (int)uVar11) {
              psVar13 = delim;
            }
            if (uVar8 % (ulong)psVar13 != 0) goto LAB_001173b7;
          }
        }
        else {
          uVar11 = 0xffffffff;
          if ((MVar1 == Throw) && (uVar11 = 1, iVar12 < 0)) {
            uVar11 = uVar10 | 1;
          }
          if (uVar8 != (long)(int)(uVar11 * iVar7)) {
            pAVar9 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
            get_name_abi_cxx11_(&local_70,this,false,false);
            uVar11 = 0xffffffff;
            if (((this->super_OptionBase<CLI::Option>).multi_option_policy_ == Throw) &&
               (uVar11 = 1, this->expected_ < 0)) {
              uVar11 = this->type_size_ >> 0x1f | 1;
            }
            iVar7 = this->expected_ * this->type_size_;
            iVar12 = -iVar7;
            if (0 < iVar7) {
              iVar12 = iVar7;
            }
            ArgumentMismatch::ArgumentMismatch
                      (pAVar9,&local_70,iVar12 * uVar11,
                       (long)(this->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
            __cxa_throw(pAVar9,&ArgumentMismatch::typeinfo,Error::~Error);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_148,this_00);
        if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
          ::std::__throw_bad_function_call();
        }
        bVar4 = (*(this->callback_)._M_invoker)
                          ((_Any_data *)&this->callback_,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_148);
        this_04 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
        goto LAB_00117296;
      }
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a8,
                 __last._M_current + -(long)iVar6,__last,(allocator_type *)local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_100,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1a8);
      if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
      bVar4 = (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&local_100);
      this_03 = &local_100;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_03);
    this_04 = &local_1a8;
  }
LAB_00117296:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_04);
  if (bVar4 != false) {
    return;
  }
  this_02 = (ConversionError *)__cxa_allocate_exception(0x38);
  get_name_abi_cxx11_(&local_b0,this,false,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c8,this_00);
  ConversionError::ConversionError(this_02,&local_b0,&local_c8);
  __cxa_throw(this_02,&ConversionError::typeinfo,Error::~Error);
}

Assistant:

void run_callback() {

        // Run the validators (can change the string)
        if(!validators_.empty()) {
            for(std::string &result : results_)
                for(const std::function<std::string(std::string &)> &vali : validators_) {
                    std::string err_msg = vali(result);
                    if(!err_msg.empty())
                        throw ValidationError(get_name(), err_msg);
                }
        }

        bool local_result;

        // Num items expected or length of vector, always at least 1
        // Only valid for a trimming policy
        int trim_size =
            std::min<int>(std::max<int>(std::abs(get_items_expected()), 1), static_cast<int>(results_.size()));

        // Operation depends on the policy setting
        if(multi_option_policy_ == MultiOptionPolicy::TakeLast) {
            // Allow multi-option sizes (including 0)
            results_t partial_result{results_.end() - trim_size, results_.end()};
            local_result = !callback_(partial_result);

        } else if(multi_option_policy_ == MultiOptionPolicy::TakeFirst) {
            results_t partial_result{results_.begin(), results_.begin() + trim_size};
            local_result = !callback_(partial_result);

        } else if(multi_option_policy_ == MultiOptionPolicy::Join) {
            results_t partial_result = {detail::join(results_, "\n")};
            local_result = !callback_(partial_result);

        } else {
            // Exact number required
            if(get_items_expected() > 0) {
                if(results_.size() != static_cast<size_t>(get_items_expected()))
                    throw ArgumentMismatch(get_name(), get_items_expected(), results_.size());
                // Variable length list
            } else if(get_items_expected() < 0) {
                // Require that this be a multiple of expected size and at least as many as expected
                if(results_.size() < static_cast<size_t>(-get_items_expected()) ||
                   results_.size() % static_cast<size_t>(std::abs(get_type_size())) != 0)
                    throw ArgumentMismatch(get_name(), get_items_expected(), results_.size());
            }
            local_result = !callback_(results_);
        }

        if(local_result)
            throw ConversionError(get_name(), results_);
    }